

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O0

void __thiscall
amrex::MLABecLaplacian::normalize(MLABecLaplacian *this,int amrlev,int mglev,MultiFab *mf)

{
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> _Var1;
  bool bVar2;
  Geometry *this_00;
  long lVar3;
  MFIter *in_RDI;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *bzfab;
  Array4<const_double> *byfab;
  Array4<const_double> *bxfab;
  Array4<const_double> *afab;
  Array4<double> *fab;
  Box *bx;
  MFIter mfi;
  int ncomp;
  Real bscalar;
  Real ascalar;
  GpuArray<double,_3U> dxinv;
  MultiFab *bzcoef;
  MultiFab *bycoef;
  MultiFab *bxcoef;
  MultiFab *acoef;
  Real dhz;
  Real dhy;
  Real dhx;
  size_type in_stack_fffffffffffffad8;
  int *piVar4;
  MFIter *in_stack_fffffffffffffae0;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffae8;
  undefined8 in_stack_fffffffffffffb00;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_fffffffffffffb08;
  long *plVar5;
  int local_4e0;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  undefined4 in_stack_fffffffffffffb40;
  int in_stack_fffffffffffffb44;
  long local_490 [8];
  long *local_450;
  long local_448 [8];
  long *local_408;
  long local_400 [8];
  long *local_3c0;
  undefined1 local_3b8 [136];
  MFIter *local_330;
  int local_324 [7];
  int *local_308;
  MFIter local_300;
  int local_29c;
  void *local_298;
  MultiArray4<double> local_290;
  GpuArray<double,_3U> local_288;
  pointer local_270;
  const_reference local_268;
  const_reference local_260;
  MultiFab *local_258;
  undefined8 local_238;
  int local_230;
  int *local_228;
  int local_21c;
  int iStack_218;
  int local_214;
  undefined8 local_210;
  int local_208;
  int *local_200;
  int local_1f4;
  int iStack_1f0;
  int local_1ec;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  void *local_1d0;
  Array4<double> *local_1c8;
  GpuArray<double,_3U> *local_1c0;
  long *local_1b8;
  long *local_1b0;
  long *local_1a8;
  FabArray<amrex::FArrayBox> *local_1a0;
  MFIter *local_198;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  long *local_170;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  long *local_158;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  long *local_140;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  long *local_128;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  long *local_110;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  long *local_f8;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  MFIter *local_e0;
  undefined4 local_d4;
  int *local_d0;
  undefined4 local_c4;
  int *local_c0;
  undefined4 local_b4;
  int *local_b0;
  undefined4 local_a4;
  int *local_a0;
  undefined4 local_94;
  int *local_90;
  undefined4 local_84;
  int *local_80;
  undefined4 local_74;
  GpuArray<double,_3U> *local_70;
  undefined4 local_64;
  GpuArray<double,_3U> *local_60;
  undefined4 local_54;
  GpuArray<double,_3U> *local_50;
  undefined4 local_44;
  GpuArray<double,_3U> *local_40;
  undefined4 local_34;
  GpuArray<double,_3U> *local_30;
  undefined4 local_24;
  GpuArray<double,_3U> *local_20;
  int local_14;
  int local_10;
  int local_c;
  FabArray<amrex::FArrayBox> *local_8;
  
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffffb00 >> 0x38);
  Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  local_258 = Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                        ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                         in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  local_260 = std::array<amrex::MultiFab,_3UL>::operator[]
                        ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffffae0,
                         in_stack_fffffffffffffad8);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  local_268 = std::array<amrex::MultiFab,_3UL>::operator[]
                        ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffffae0,
                         in_stack_fffffffffffffad8);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  local_270 = (pointer)std::array<amrex::MultiFab,_3UL>::operator[]
                                 ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffffae0,
                                  in_stack_fffffffffffffad8);
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  this_00 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                      ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                       in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  CoordSys::InvCellSizeArray(&local_288,&this_00->super_CoordSys);
  local_290.hp = *(Array4<double> **)&in_RDI[8].endIndex;
  local_298 = *(void **)&in_RDI[8].typ;
  local_29c = (**(code **)((long)&((in_RDI->m_fa)._M_t.
                                   super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                   .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl
                                  )->boxarray + 0x20))();
  TilingIfNotGPU();
  MFIter::MFIter(in_RDI,in_stack_fffffffffffffb08,(bool)do_tiling_);
  while (bVar2 = MFIter::isValid(&local_300), bVar2) {
    piVar4 = local_324;
    MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    in_stack_fffffffffffffae0 = (MFIter *)(local_3b8 + 0x48);
    local_308 = piVar4;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
    in_stack_fffffffffffffae8 = (FabArray<amrex::FArrayBox> *)local_3b8;
    local_330 = in_stack_fffffffffffffae0;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
    local_3b8._64_8_ = in_stack_fffffffffffffae8;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
    local_3c0 = local_400;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
    plVar5 = local_490;
    local_408 = local_448;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
    local_228 = local_308;
    local_80 = local_308;
    local_84 = 0;
    local_21c = *local_308;
    local_90 = local_308;
    local_94 = 1;
    iStack_218 = local_308[1];
    local_238 = *(undefined8 *)local_308;
    local_a0 = local_308;
    local_a4 = 2;
    local_230 = local_308[2];
    local_200 = local_308;
    local_b0 = local_308 + 3;
    local_b4 = 0;
    in_stack_fffffffffffffb44 = *local_b0;
    local_c0 = local_308 + 3;
    local_c4 = 1;
    iStack_1f0 = local_308[4];
    local_210 = *(undefined8 *)local_b0;
    local_d0 = local_308 + 3;
    local_d4 = 2;
    local_208 = local_308[5];
    for (local_4d4 = 0; local_4d8 = local_230, local_4d4 < local_29c; local_4d4 = local_4d4 + 1) {
      for (; local_4dc = iStack_218, local_4d8 <= local_208; local_4d8 = local_4d8 + 1) {
        for (; local_4e0 = local_21c, local_4dc <= iStack_1f0; local_4dc = local_4dc + 1) {
          for (; local_4e0 <= in_stack_fffffffffffffb44; local_4e0 = local_4e0 + 1) {
            local_184 = local_4e0;
            local_188 = local_4dc;
            local_18c = local_4d8;
            local_190 = local_4d4;
            local_198 = local_330;
            local_1a0 = (FabArray<amrex::FArrayBox> *)local_3b8._64_8_;
            local_1a8 = local_3c0;
            local_1b0 = local_408;
            local_1c8 = local_290.hp;
            local_1d0 = local_298;
            local_1c0 = &local_288;
            local_24 = 0;
            local_34 = 0;
            local_1d8 = (double)local_298 * local_288.arr[0] * local_288.arr[0];
            local_44 = 1;
            local_54 = 1;
            local_1e0 = (double)local_298 * local_288.arr[1] * local_288.arr[1];
            local_64 = 2;
            local_74 = 2;
            local_1e8 = (double)local_298 * local_288.arr[2] * local_288.arr[2];
            local_8 = (FabArray<amrex::FArrayBox> *)local_3b8._64_8_;
            local_c = local_4e0;
            local_10 = local_4dc;
            local_14 = local_4d8;
            local_f8 = local_3c0;
            local_fc = local_4e0;
            local_100 = local_4dc;
            local_104 = local_4d8;
            local_108 = local_4d4;
            local_110 = local_3c0;
            local_114 = local_4e0 + 1;
            local_118 = local_4dc;
            local_11c = local_4d8;
            local_120 = local_4d4;
            local_128 = local_408;
            local_12c = local_4e0;
            local_130 = local_4dc;
            local_134 = local_4d8;
            local_138 = local_4d4;
            local_140 = local_408;
            local_144 = local_4e0;
            local_148 = local_4dc + 1;
            local_14c = local_4d8;
            local_150 = local_4d4;
            local_15c = local_4e0;
            local_160 = local_4dc;
            local_164 = local_4d8;
            local_168 = local_4d4;
            local_174 = local_4e0;
            local_178 = local_4dc;
            local_17c = local_4d8 + 1;
            local_180 = local_4d4;
            local_e0 = local_330;
            local_e4 = local_4e0;
            local_e8 = local_4dc;
            local_ec = local_4d8;
            local_f0 = local_4d4;
            _Var1._M_head_impl =
                 (local_330->m_fa)._M_t.
                 super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                 .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
            lVar3 = (long)(local_4e0 - local_330->currentIndex) +
                    (long)(local_4dc - local_330->beginIndex) * (long)local_330->fabArray +
                    (long)(local_4d8 - local_330->endIndex) * *(long *)(local_330->tile_size).vect +
                    (long)local_4d4 * *(long *)((local_330->tile_size).vect + 2);
            *(double *)((long)&(_Var1._M_head_impl)->_vptr_FabArrayBase + lVar3 * 8) =
                 *(double *)((long)&(_Var1._M_head_impl)->_vptr_FabArrayBase + lVar3 * 8) /
                 (local_1e8 *
                  (*(double *)
                    (*plVar5 +
                    ((long)(local_4e0 - (int)plVar5[4]) +
                     (long)(local_4dc - *(int *)((long)plVar5 + 0x24)) * plVar5[1] +
                     (long)(local_4d8 - (int)plVar5[5]) * plVar5[2] + (long)local_4d4 * plVar5[3]) *
                    8) + *(double *)
                          (*plVar5 +
                          ((long)(local_4e0 - (int)plVar5[4]) +
                           (long)(local_4dc - *(int *)((long)plVar5 + 0x24)) * plVar5[1] +
                           (long)(local_17c - (int)plVar5[5]) * plVar5[2] +
                          (long)local_4d4 * plVar5[3]) * 8)) +
                 local_1e0 *
                 (*(double *)
                   (*local_408 +
                   ((long)(local_4e0 - (int)local_408[4]) +
                    (long)(local_4dc - *(int *)((long)local_408 + 0x24)) * local_408[1] +
                    (long)(local_4d8 - (int)local_408[5]) * local_408[2] +
                   (long)local_4d4 * local_408[3]) * 8) +
                 *(double *)
                  (*local_408 +
                  ((long)(local_4e0 - (int)local_408[4]) +
                   (long)(local_148 - *(int *)((long)local_408 + 0x24)) * local_408[1] +
                   (long)(local_4d8 - (int)local_408[5]) * local_408[2] +
                  (long)local_4d4 * local_408[3]) * 8)) +
                 (double)local_290.hp *
                 *(double *)
                  (*(long *)local_3b8._64_8_ +
                  ((long)(local_4e0 - *(int *)(local_3b8._64_8_ + 0x20)) +
                   (long)(local_4dc - *(int *)(local_3b8._64_8_ + 0x24)) *
                   *(long *)&((BoxArray *)(local_3b8._64_8_ + 8))->m_bat +
                  (long)(local_4d8 - *(int *)(local_3b8._64_8_ + 0x28)) *
                  *(long *)(local_3b8._64_8_ + 0x10)) * 8) +
                 local_1d8 *
                 (*(double *)
                   (*local_3c0 +
                   ((long)(local_4e0 - (int)local_3c0[4]) +
                    (long)(local_4dc - *(int *)((long)local_3c0 + 0x24)) * local_3c0[1] +
                    (long)(local_4d8 - (int)local_3c0[5]) * local_3c0[2] +
                   (long)local_4d4 * local_3c0[3]) * 8) +
                 *(double *)
                  (*local_3c0 +
                  ((long)(local_114 - (int)local_3c0[4]) +
                   (long)(local_4dc - *(int *)((long)local_3c0 + 0x24)) * local_3c0[1] +
                   (long)(local_4d8 - (int)local_3c0[5]) * local_3c0[2] +
                  (long)local_4d4 * local_3c0[3]) * 8)));
            local_1b8 = plVar5;
            local_170 = plVar5;
            local_158 = plVar5;
            local_70 = local_1c0;
            local_60 = local_1c0;
            local_50 = local_1c0;
            local_40 = local_1c0;
            local_30 = local_1c0;
            local_20 = local_1c0;
          }
        }
      }
    }
    local_450 = plVar5;
    local_214 = local_230;
    local_1f4 = in_stack_fffffffffffffb44;
    local_1ec = local_208;
    MFIter::operator++(&local_300);
  }
  MFIter::~MFIter(in_stack_fffffffffffffae0);
  return;
}

Assistant:

void
MLABecLaplacian::normalize (int amrlev, int mglev, MultiFab& mf) const
{
    BL_PROFILE("MLABecLaplacian::normalize()");

    const MultiFab& acoef = m_a_coeffs[amrlev][mglev];
    AMREX_D_TERM(const MultiFab& bxcoef = m_b_coeffs[amrlev][mglev][0];,
                 const MultiFab& bycoef = m_b_coeffs[amrlev][mglev][1];,
                 const MultiFab& bzcoef = m_b_coeffs[amrlev][mglev][2];);

    const auto dxinv = m_geom[amrlev][mglev].InvCellSizeArray();

    const Real ascalar = m_a_scalar;
    const Real bscalar = m_b_scalar;

    const int ncomp = getNComp();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && mf.isFusingCandidate()) {
        const auto& ma = mf.arrays();
        const auto& ama = acoef.const_arrays();
        AMREX_D_TERM(const auto& bxma = bxcoef.const_arrays();,
                     const auto& byma = bycoef.const_arrays();,
                     const auto& bzma = bzcoef.const_arrays(););
        ParallelFor(mf, IntVect(0), ncomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            mlabeclap_normalize(i,j,k,n, ma[box_no], ama[box_no],
                                AMREX_D_DECL(bxma[box_no],byma[box_no],bzma[box_no]),
                                dxinv, ascalar, bscalar);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(mf, TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            const auto& fab = mf.array(mfi);
            const auto& afab = acoef.array(mfi);
            AMREX_D_TERM(const auto& bxfab = bxcoef.array(mfi);,
                         const auto& byfab = bycoef.array(mfi);,
                         const auto& bzfab = bzcoef.array(mfi););

            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
            {
                mlabeclap_normalize(i,j,k,n, fab, afab, AMREX_D_DECL(bxfab,byfab,bzfab),
                                    dxinv, ascalar, bscalar);
            });
        }
    }
}